

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O0

spv_result_t
spvtools::val::anon_unknown_11::setHeader
          (void *user_data,spv_endianness_t param_2,uint32_t param_3,uint32_t version,
          uint32_t generator,uint32_t id_bound,uint32_t param_7)

{
  ValidationState_t *vstate;
  uint32_t id_bound_local;
  uint32_t generator_local;
  uint32_t version_local;
  uint32_t param_2_local;
  spv_endianness_t param_1_local;
  void *user_data_local;
  
  ValidationState_t::setIdBound((ValidationState_t *)user_data,id_bound);
  ValidationState_t::setGenerator((ValidationState_t *)user_data,generator);
  ValidationState_t::setVersion((ValidationState_t *)user_data,version);
  return SPV_SUCCESS;
}

Assistant:

spv_result_t setHeader(void* user_data, spv_endianness_t, uint32_t,
                       uint32_t version, uint32_t generator, uint32_t id_bound,
                       uint32_t) {
  ValidationState_t& vstate =
      *(reinterpret_cast<ValidationState_t*>(user_data));
  vstate.setIdBound(id_bound);
  vstate.setGenerator(generator);
  vstate.setVersion(version);

  return SPV_SUCCESS;
}